

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O0

AliasRet aa_table(jit_State *J,IRRef ta,IRRef tb)

{
  IRIns *pIVar1;
  bool bVar2;
  bool bVar3;
  IRIns *tmp;
  int newb;
  int newa;
  IRIns *tabb;
  IRIns *taba;
  IRRef tb_local;
  IRRef ta_local;
  jit_State *J_local;
  
  pIVar1 = (J->cur).ir + ta;
  tabb = (J->cur).ir + tb;
  bVar2 = true;
  if ((pIVar1->field_1).o != 'Q') {
    bVar2 = (pIVar1->field_1).o == 'R';
  }
  bVar3 = true;
  if ((tabb->field_1).o != 'Q') {
    bVar3 = (tabb->field_1).o == 'R';
  }
  if ((bVar2) && (bVar3)) {
    J_local._4_4_ = ALIAS_NO;
  }
  else {
    _newb = pIVar1;
    if ((bVar3) || (_newb = tabb, tabb = pIVar1, bVar2)) {
      J_local._4_4_ = aa_escape(J,tabb,_newb);
    }
    else {
      J_local._4_4_ = ALIAS_MAY;
    }
  }
  return J_local._4_4_;
}

Assistant:

static AliasRet aa_table(jit_State *J, IRRef ta, IRRef tb)
{
  IRIns *taba = IR(ta), *tabb = IR(tb);
  int newa, newb;
  lj_assertJ(ta != tb, "bad usage");
  lj_assertJ(irt_istab(taba->t) && irt_istab(tabb->t), "bad usage");
  /* Disambiguate new allocations. */
  newa = (taba->o == IR_TNEW || taba->o == IR_TDUP);
  newb = (tabb->o == IR_TNEW || tabb->o == IR_TDUP);
  if (newa && newb)
    return ALIAS_NO;  /* Two different allocations never alias. */
  if (newb) {  /* At least one allocation? */
    IRIns *tmp = taba; taba = tabb; tabb = tmp;
  } else if (!newa) {
    return ALIAS_MAY;  /* Anything else: we just don't know. */
  }
  return aa_escape(J, taba, tabb);
}